

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void R_DrawFuzzColumnP_C(void)

{
  int iVar1;
  BYTE *pBVar2;
  int iVar3;
  BYTE *map;
  int local_20;
  int cnt;
  int fuzz;
  int pitch;
  BYTE *dest;
  int count;
  
  pBVar2 = NormalLight.Maps;
  iVar1 = dc_pitch;
  if (dc_yl == 0) {
    dc_yl = 1;
  }
  if (fuzzviewheight < dc_yh) {
    dc_yh = fuzzviewheight;
  }
  if (-1 < dc_yh - dc_yl) {
    dest._4_4_ = (dc_yh - dc_yl) + 1;
    _fuzz = dc_destorg + (ylookup[dc_yl] + dc_x);
    local_20 = fuzzpos;
    if (fuzzpos != 0) {
      map._4_4_ = MIN<int>(0x32 - fuzzpos,dest._4_4_);
      dest._4_4_ = dest._4_4_ - map._4_4_;
      do {
        iVar3 = local_20 + 1;
        *_fuzz = pBVar2[(ulong)_fuzz[fuzzoffset[local_20]] + 0x600];
        _fuzz = _fuzz + iVar1;
        map._4_4_ = map._4_4_ + -1;
        local_20 = iVar3;
      } while (map._4_4_ != 0);
    }
    if ((local_20 == 0x32) || (0 < dest._4_4_)) {
      while (0x31 < dest._4_4_) {
        local_20 = 0;
        map._4_4_ = 0x32;
        dest._4_4_ = dest._4_4_ + -0x32;
        do {
          *_fuzz = pBVar2[(ulong)_fuzz[fuzzoffset[local_20]] + 0x600];
          _fuzz = _fuzz + iVar1;
          map._4_4_ = map._4_4_ + -1;
          local_20 = local_20 + 1;
        } while (map._4_4_ != 0);
      }
      local_20 = 0;
      if (0 < dest._4_4_) {
        do {
          iVar3 = local_20 + 1;
          *_fuzz = pBVar2[(ulong)_fuzz[fuzzoffset[local_20]] + 0x600];
          _fuzz = _fuzz + iVar1;
          dest._4_4_ = dest._4_4_ + -1;
          local_20 = iVar3;
        } while (dest._4_4_ != 0);
      }
    }
    fuzzpos = local_20;
  }
  return;
}

Assistant:

void R_DrawFuzzColumnP_C (void)
{
	int count;
	BYTE *dest;

	// Adjust borders. Low...
	if (dc_yl == 0)
		dc_yl = 1;

	// .. and high.
	if (dc_yh > fuzzviewheight)
		dc_yh = fuzzviewheight;

	count = dc_yh - dc_yl;

	// Zero length.
	if (count < 0)
		return;

	count++;

	dest = ylookup[dc_yl] + dc_x + dc_destorg;

	// colormap #6 is used for shading (of 0-31, a bit brighter than average)
	{
		// [RH] Make local copies of global vars to try and improve
		//		the optimizations made by the compiler.
		int pitch = dc_pitch;
		int fuzz = fuzzpos;
		int cnt;
		BYTE *map = &NormalLight.Maps[6*256];

		// [RH] Split this into three separate loops to minimize
		// the number of times fuzzpos needs to be clamped.
		if (fuzz)
		{
			cnt = MIN(FUZZTABLE-fuzz,count);
			count -= cnt;
			do
			{
				*dest = map[dest[fuzzoffset[fuzz++]]];
				dest += pitch;
			} while (--cnt);
		}
		if (fuzz == FUZZTABLE || count > 0)
		{
			while (count >= FUZZTABLE)
			{
				fuzz = 0;
				cnt = FUZZTABLE;
				count -= FUZZTABLE;
				do
				{
					*dest = map[dest[fuzzoffset[fuzz++]]];
					dest += pitch;
				} while (--cnt);
			}
			fuzz = 0;
			if (count > 0)
			{
				do
				{
					*dest = map[dest[fuzzoffset[fuzz++]]];
					dest += pitch;
				} while (--count);
			}
		}
		fuzzpos = fuzz;
	}
}